

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

Configuration *
rc::detail::configFromString
          (Configuration *__return_storage_ptr__,string *str,Configuration *defaults)

{
  ParseException *e;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  Configuration *local_20;
  Configuration *defaults_local;
  string *str_local;
  
  local_20 = defaults;
  defaults_local = (Configuration *)str;
  str_local = (string *)__return_storage_ptr__;
  parseMap(&local_50,str);
  anon_unknown_10::configFromMap(__return_storage_ptr__,&local_50,local_20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Configuration configFromString(const std::string &str,
                               const Configuration &defaults) {
  try {
    return configFromMap(parseMap(str), defaults);
  } catch (const ParseException &e) {
    throw ConfigurationException(
        std::string("Failed to parse configuration string -- ") + e.what());
  }
}